

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O1

void oss_gets_delchar(osgen_txtwin_t *win,char *buf,char *p,char **eol,int x,int y)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t __n;
  uint x_00;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = (ulong)eol & 0xffffffff;
  x_00 = (uint)eol;
  iVar2 = ossgetcolor((int)(win->base).txtfg,(int)(win->base).txtbg,(win->base).txtattr,
                      (int)(win->base).fillcolor);
  if (buf < *(char **)p) {
    pcVar3 = *(char **)p + -1;
    *(char **)p = pcVar3;
    __n = (long)pcVar3 - (long)buf;
    if (__n != 0) {
      memmove(buf,buf + 1,__n);
    }
    **(undefined1 **)p = 0;
    ossdsp_str(&win->base,x,x_00,iVar2,buf,*(long *)p - (long)buf,(int *)0x0);
    if (*(char **)p != buf) {
      uVar1 = (win->base).winx;
      iVar2 = (int)(win->base).wid + uVar1;
      lVar6 = (long)buf - (long)*(char **)p;
      do {
        uVar4 = (int)uVar5 + 1;
        x_00 = uVar4;
        if (iVar2 <= (int)uVar4) {
          x_00 = uVar1;
        }
        uVar5 = (ulong)x_00;
        x = x + (uint)(iVar2 <= (int)uVar4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0);
    }
    ossclr(x,x_00,x,x_00,(win->base).oss_fillcolor);
    return;
  }
  return;
}

Assistant:

static void oss_gets_delchar(osgen_txtwin_t *win,
                             char *buf, char *p, char **eol, int x, int y)
{
    int color;
    
    /* get the oss color for the current text in the window */
    color = ossgetcolor(win->base.txtfg, win->base.txtbg,
                        win->base.txtattr, win->base.fillcolor);

    /* if the character is within the buffer, delete it */
    if (p < *eol)
    {
        /* delete the character and close the gap */
        --*eol;
        if (p != *eol)
            memmove(p, p + 1, *eol - p);

        /* null-terminate the shortened buffer */
        **eol = '\0';
        
        /* re-display the changed part of the string */
        ossdsp_str(&win->base, y, x, color, p, *eol - p, 0);

        /* move to the position of the former last character */
        oss_gets_csrright(win, &y, &x, *eol - p);

        /* clear the screen area where the old last character was displayed */
        ossclr(y, x, y, x, win->base.oss_fillcolor);
    }
}